

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

void __thiscall asl::WebSocketServer::serve(WebSocketServer *this,Socket *client)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  String *pSVar5;
  char *pcVar6;
  char local_1a4;
  String local_158;
  String local_140;
  String local_128;
  undefined1 local_110 [8];
  String value;
  int k;
  bool capitalize;
  String cname;
  String name;
  int c;
  Map<asl::String,_asl::String> local_a0;
  Dic<asl::String> headers;
  String line;
  String res;
  String method;
  int j;
  undefined1 local_30 [4];
  int i;
  String head;
  Socket *client_local;
  WebSocketServer *this_local;
  
  head.field_2._8_8_ = client;
  Socket::readLine((String *)local_30,client);
  iVar3 = asl::String::indexOf((String *)local_30,' ',0);
  if ((iVar3 != -1) && (iVar4 = asl::String::indexOf((String *)local_30,' ',iVar3 + 1), iVar4 != -1)
     ) {
    asl::String::substring((String *)((long)&res.field_2 + 8),(String *)local_30,0,iVar3);
    asl::String::substring((String *)((long)&line.field_2 + 8),(String *)local_30,iVar3 + 1,iVar4);
    asl::String::String((String *)&headers);
    Dic<asl::String>::Dic((Dic<asl::String> *)&local_a0);
    while( true ) {
      Socket::readLine((String *)&stack0xffffffffffffff48,client);
      asl::String::operator=((String *)&headers,(String *)&stack0xffffffffffffff48);
      bVar2 = asl::String::operator!=((String *)&headers,"\r");
      asl::String::~String((String *)&stack0xffffffffffffff48);
      if (!bVar2) break;
      pSVar5 = asl::String::trim((String *)&headers);
      asl::String::operator=((String *)&headers,pSVar5);
      iVar4 = 0x3a;
      iVar3 = asl::String::indexOf((String *)&headers,':',0);
      if (iVar3 < 0) {
        Socket::close(client,iVar4);
        goto LAB_0014af54;
      }
      asl::String::substring((String *)((long)&cname.field_2 + 8),(String *)&headers,0,iVar3);
      asl::String::String((String *)&k);
      value.field_2._space[0xf] = '\x01';
      for (value.field_2._8_4_ = 0; uVar1 = value.field_2._8_4_,
          iVar4 = asl::String::length((String *)((long)&cname.field_2 + 8)), (int)uVar1 < iVar4;
          value.field_2._8_4_ = value.field_2._8_4_ + 1) {
        if ((value.field_2._space[0xf] & 1U) == 0) {
          pcVar6 = asl::String::operator[]((String *)((long)&cname.field_2 + 8),value.field_2._8_4_)
          ;
          iVar4 = tolower((int)*pcVar6);
          local_1a4 = (char)iVar4;
        }
        else {
          pcVar6 = asl::String::operator[]((String *)((long)&cname.field_2 + 8),value.field_2._8_4_)
          ;
          iVar4 = toupper((int)*pcVar6);
          local_1a4 = (char)iVar4;
        }
        asl::String::operator<<((String *)&k,local_1a4);
        pcVar6 = asl::String::operator[]((String *)((long)&cname.field_2 + 8),value.field_2._8_4_);
        iVar4 = isalnum((int)*pcVar6);
        value.field_2._space[0xf] = (iVar4 != 0 ^ 0xffU) & 1;
      }
      iVar4 = asl::String::length((String *)&headers);
      if (iVar3 < iVar4 + -1) {
        asl::String::substring((String *)local_110,(String *)&headers,iVar3 + 2);
      }
      else {
        asl::String::String((String *)local_110);
      }
      pSVar5 = Map<asl::String,_asl::String>::operator[](&local_a0,(String *)&k);
      asl::String::operator=(pSVar5,(String *)local_110);
      asl::String::~String((String *)local_110);
      asl::String::~String((String *)&k);
      asl::String::~String((String *)((long)&cname.field_2 + 8));
    }
    asl::String::String(&local_140,"\n");
    asl::String::String(&local_158,": ");
    Map<asl::String,_asl::String>::join(&local_128,&local_a0,&local_140,&local_158);
    pcVar6 = asl::String::operator*(&local_128);
    DEBUG_LOG("%s\n\n\n",pcVar6);
    asl::String::~String(&local_128);
    asl::String::~String(&local_158);
    asl::String::~String(&local_140);
    process(this,client,(Dic<asl::String> *)&local_a0);
LAB_0014af54:
    Dic<asl::String>::~Dic((Dic<asl::String> *)&local_a0);
    asl::String::~String((String *)&headers);
    asl::String::~String((String *)((long)&line.field_2 + 8));
    asl::String::~String((String *)((long)&res.field_2 + 8));
  }
  asl::String::~String((String *)local_30);
  return;
}

Assistant:

void WebSocketServer::serve(Socket client)
{
	String head = client.readLine();
	int i = head.indexOf(' ');
	if (i == -1)
		return;
	int j = head.indexOf(' ', i + 1);
	if (j == -1)
		return;
	String method = head.substring(0, i);
	String res = head.substring(i + 1, j);

	String line;
	Dic<String> headers;
	while (line = client.readLine(), line != "\r")
	{
		line = line.trim();
		int c = line.indexOf(':');
		if (c < 0) {
			client.close();
			return;
		}
		String name = line.substring(0, c);
		String cname;
		bool capitalize = true;
		for (int k = 0; k < name.length(); k++)
		{
			cname << char(capitalize ? toupper(name[k]) : tolower(name[k]));
			capitalize = !isalnum(name[k]);
		}

		String value = (c < line.length() - 1) ? line.substring(c + 2) : String();
		headers[cname] = value;
	}

	DEBUG_LOG("%s\n\n\n", *headers.join("\n", ": "));

	process(client, headers);
}